

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseComparisonExpression(Parser *this)

{
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *in_RSI;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(code **)local_40._M_unused._0_8_ = parseArithmeticExpression;
  *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
  *(function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> **)
   ((long)local_40._M_unused._0_8_ + 0x10) = in_RSI;
  local_28 = std::
             _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(),_std::_Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>_>
             ::_M_manager;
  local_58 = 0;
  local_60 = Token::isComparisonOperator;
  local_48 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_invoke;
  local_50 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_manager;
  parseExpression(this,in_RSI,(function<bool_(const_Token_&)> *)&local_40);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseComparisonExpression()
{
  return parseExpression(std::bind(&Parser::parseArithmeticExpression, this), Token::isComparisonOperator);
}